

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineSearch.h
# Opt level: O3

string * __thiscall
EngineSearch::operator()[abi_cxx11_(string *__return_storage_ptr__,EngineSearch *this,Token *token)

{
  pointer pcVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  char *pcVar5;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> uVar6;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type sVar11;
  size_type sVar12;
  undefined8 uVar13;
  _Base_ptr *pp_Var14;
  size_type *psVar15;
  Error extraout_EDX;
  Error extraout_EDX_00;
  Error EVar16;
  Error extraout_EDX_01;
  Error extraout_EDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_type __rlen;
  char *pcVar18;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar19;
  string_view subtoken;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  string __str;
  string redirectUrl;
  string __str_1;
  string tokenName;
  string url;
  _Any_data local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Base_ptr local_1c8;
  size_t local_1c0;
  string local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Base_ptr p_Stack_168;
  _Alloc_hider local_160;
  char *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Base_ptr *local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Base_ptr p_Stack_120;
  size_type *local_118;
  _Alloc_hider local_110;
  size_type local_108;
  undefined1 auStack_100 [16];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  char *local_d0;
  _Any_data local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Result local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (token->type != std) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (token->content)._M_dataplus._M_p;
  aStack_e0._8_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (token->content)._M_string_length);
  uVar8 = std::__cxx11::string::find((char *)&local_b0,0x175f09,0);
  if (uVar8 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_b0,uVar8,(char *)0x2,0x1761c9);
      uVar8 = std::__cxx11::string::find((char *)&local_b0,0x175f09,uVar8 + 6);
    } while (uVar8 != 0xffffffffffffffff);
  }
  std::operator+(&local_50,"/mwiki/index.php?title=Special%3ASearch&search=",&local_b0);
  puVar10 = *(undefined8 **)aStack_e0._8_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208._M_pod_data,local_50._M_dataplus._M_p,(allocator<char> *)&local_118
            );
  local_188._8_8_ = local_198 + 8;
  local_188._0_8_ = (_Base_ptr)0x0;
  local_198._0_8_ = (Response *)0x0;
  local_198._8_8_ = 0;
  local_178._8_8_ = (_Base_ptr)0x0;
  local_1e8._0_8_ = (void *)0x0;
  local_1e8._8_8_ = 0;
  local_1d8._M_allocated_capacity = 0;
  local_1d8._8_8_ = (_Invoker_type)0x0;
  local_178._M_allocated_capacity = local_188._8_8_;
  httplib::ClientImpl::Get
            (&local_90,(ClientImpl *)*puVar10,(string *)&local_208,(Headers *)local_198,
             (Progress *)local_1e8);
  if ((_Manager_type)local_1d8._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_1d8._M_allocated_capacity)(local_1e8,local_1e8,3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_198);
  EVar16 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != &local_1f8) {
    operator_delete(local_208._M_unused._M_object,local_1f8._M_allocated_capacity + 1);
    EVar16 = extraout_EDX_00;
  }
  uVar6._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       local_90.res_;
  httplib::to_string_abi_cxx11_((string *)local_198,(httplib *)(ulong)local_90.err_,EVar16);
  auStack_100._8_8_ = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_100 + 8),"File: ","");
  plVar9 = (long *)std::__cxx11::string::append(auStack_100 + 8);
  local_138 = &local_128;
  pp_Var14 = (_Base_ptr *)(plVar9 + 2);
  if ((_Base_ptr *)*plVar9 == pp_Var14) {
    local_128 = *pp_Var14;
    p_Stack_120 = (_Base_ptr)plVar9[3];
  }
  else {
    local_128 = *pp_Var14;
    local_138 = (_Base_ptr *)*plVar9;
  }
  local_130 = (_Base_ptr)plVar9[1];
  *plVar9 = (long)pp_Var14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_1b8.field_2._M_allocated_capacity = *psVar15;
    local_1b8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar15;
    local_1b8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1b8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar15) {
    local_108 = *psVar15;
    auStack_100._0_8_ = plVar9[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *psVar15;
    local_118 = (size_type *)*plVar9;
  }
  local_110._M_p = (pointer)plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar17) {
    local_1f8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1f8._8_8_ = puVar10[3];
    local_208._M_unused._0_8_ = (undefined8)&local_1f8;
  }
  else {
    local_1f8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_208._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_208._8_8_ = puVar10[1];
  *puVar10 = paVar17;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_158 = local_150._M_local_buf + 8;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x02');
  pcVar18 = local_158;
  pcVar18[0] = '2';
  pcVar18[1] = '9';
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != &local_1f8) {
    uVar13 = local_1f8._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_150._M_allocated_capacity + local_208._8_8_) {
    uVar13 = 0xf;
    if (local_158 != local_150._M_local_buf + 8) {
      uVar13 = local_150._8_8_;
    }
    if ((ulong)uVar13 < local_150._M_allocated_capacity + local_208._8_8_) goto LAB_0015175c;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_158,0,(char *)0x0,local_208._M_unused._M_member_pointer);
  }
  else {
LAB_0015175c:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_208._M_pod_data,(ulong)local_158);
  }
  local_1e8._0_8_ = &local_1d8;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar17) {
    local_1d8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1d8._8_8_ = puVar10[3];
  }
  else {
    local_1d8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_1e8._8_8_ = puVar10[1];
  *puVar10 = paVar17;
  puVar10[1] = 0;
  paVar17->_M_local_buf[0] = '\0';
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (uVar6._M_t.
             super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
             super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
             super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0,
             (char (*) [14])"Error state: ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [2])0x173c61,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
  }
  if (local_158 != local_150._M_local_buf + 8) {
    operator_delete(local_158,local_150._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != &local_1f8) {
    operator_delete(local_208._M_unused._M_object,local_1f8._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,(ulong)((long)&local_128->_M_color + 1));
  }
  if ((size_type *)auStack_100._8_8_ != &local_e8) {
    operator_delete((void *)auStack_100._8_8_,local_e8 + 1);
  }
  if ((Response *)local_198._0_8_ != (Response *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  check<std::__cxx11::string&>
            (*(int *)((long)local_90.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20)
             == 0x12e ||
             *(int *)((long)local_90.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20)
             == 200,(string *)
                    ((long)local_90.res_._M_t.
                           super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                           .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x28));
  uVar6._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       local_90.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  local_198._0_8_ = (Response *)local_188;
  if (*(int *)((long)local_90.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) !=
      0x12e) {
    pcVar1 = (token->content)._M_dataplus._M_p;
    sVar2 = (token->content)._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,">","");
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"<","");
    subtoken._M_str = pcVar1;
    subtoken._M_len = sVar2;
    SearchBase::findLinkToSubtoken
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_208,
               (SearchBase *)aStack_e0._8_8_,
               (string *)
               ((long)uVar6._M_t.
                      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                      .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
               subtoken,(string *)local_198,(string *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
    }
    if ((Response *)local_198._0_8_ != (Response *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    if (local_1f8._M_local_buf[0] == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_208._8_8_,
                 (long)local_208._M_unused._0_8_ + local_208._8_8_);
    }
    goto LAB_00152218;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Location","");
  pVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)uVar6._M_t.
                                   super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                                   .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl +
                            0x48),(key_type *)local_198);
  uVar13 = aStack_e0._8_8_;
  if (pVar19.first._M_node._M_node == pVar19.second._M_node._M_node) {
    pcVar18 = "";
  }
  else {
    pcVar18 = *(char **)(pVar19.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,pcVar18,(allocator<char> *)local_1e8);
  if ((Response *)local_198._0_8_ != (Response *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  std::__cxx11::string::find((char *)&local_118,0x176277,0);
  std::__cxx11::string::substr((ulong)local_198,(ulong)&local_118);
  std::__cxx11::string::operator=((string *)&local_118,(string *)local_198);
  if ((Response *)local_198._0_8_ != (Response *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  puVar10 = *(undefined8 **)uVar13;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,(char *)local_118,(allocator<char> *)&local_138);
  local_1d8._8_8_ = local_1e8 + 8;
  local_1d8._M_allocated_capacity = 0;
  local_1e8._0_8_ = (void *)0x0;
  local_1e8._8_8_ = 0;
  local_1c0 = 0;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_1f8._M_allocated_capacity = 0;
  local_1f8._8_8_ = 0;
  local_1c8 = (_Base_ptr)local_1d8._8_8_;
  httplib::ClientImpl::Get
            ((Result *)local_198,(ClientImpl *)*puVar10,&local_1b8,(Headers *)local_1e8,
             (Progress *)&local_208);
  if ((code *)local_1f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_1f8._M_allocated_capacity)(&local_208,&local_208,3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1e8);
  uVar6._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       local_90.res_;
  local_90.res_._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       local_198._0_8_;
  local_198._0_8_ = (Response *)0x0;
  if ((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
      uVar6._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
      _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
      super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) {
    httplib::Response::~Response
              ((Response *)
               uVar6._M_t.
               super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
               _M_t.
               super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
               super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl);
    operator_delete((void *)uVar6._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,0x108);
  }
  local_90.err_ = local_198._8_4_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&local_90.request_headers_._M_t);
  if ((_Base_ptr)local_178._M_allocated_capacity != (_Base_ptr)0x0) {
    local_90.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_188._8_4_;
    local_90.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_178._M_allocated_capacity;
    local_90.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_178._8_8_;
    local_90.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_168;
    *(_Rb_tree_header **)(local_178._M_allocated_capacity + 8) =
         &local_90.request_headers_._M_t._M_impl.super__Rb_tree_header;
    local_90.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)local_160._M_p;
    local_178._M_allocated_capacity = 0;
    local_160._M_p = (pointer)0x0;
    local_178._8_8_ = (_Base_ptr)(local_188 + 8);
    p_Stack_168 = (_Base_ptr)(local_188 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_188);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_198);
  EVar16 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    EVar16 = extraout_EDX_02;
  }
  uVar6._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       local_90.res_;
  httplib::to_string_abi_cxx11_((string *)local_198,(httplib *)(ulong)local_90.err_,EVar16);
  local_158 = local_150._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"File: ","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_158);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar15) {
    local_e8 = *psVar15;
    aStack_e0._M_allocated_capacity = plVar9[3];
    auStack_100._8_8_ = &local_e8;
  }
  else {
    local_e8 = *psVar15;
    auStack_100._8_8_ = (size_type *)*plVar9;
  }
  local_f0._M_p = (pointer)plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(auStack_100 + 8);
  local_138 = &local_128;
  pp_Var14 = (_Base_ptr *)(plVar9 + 2);
  if ((_Base_ptr *)*plVar9 == pp_Var14) {
    local_128 = *pp_Var14;
    p_Stack_120 = (_Base_ptr)plVar9[3];
  }
  else {
    local_128 = *pp_Var14;
    local_138 = (_Base_ptr *)*plVar9;
  }
  local_130 = (_Base_ptr)plVar9[1];
  *plVar9 = (long)pp_Var14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_1b8.field_2._M_allocated_capacity = *psVar15;
    local_1b8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar15;
    local_1b8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1b8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar17) {
    local_1f8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1f8._8_8_ = puVar10[3];
    local_208._M_unused._M_object = &local_1f8;
  }
  else {
    local_1f8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_208._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_208._8_8_ = puVar10[1];
  *puVar10 = paVar17;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  pcVar18 = local_c8._M_pod_data + 8;
  local_d0 = pcVar18;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x02');
  pcVar5 = local_d0;
  pcVar5[0] = '3';
  pcVar5[1] = '7';
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != &local_1f8) {
    uVar13 = local_1f8._M_allocated_capacity;
  }
  if ((ulong)uVar13 < (ulong)((long)local_c8._M_unused._0_8_ + local_208._8_8_)) {
    uVar13 = 0xf;
    if (local_d0 != pcVar18) {
      uVar13 = local_c8._8_8_;
    }
    if ((ulong)uVar13 < (ulong)((long)local_c8._M_unused._0_8_ + local_208._8_8_))
    goto LAB_00151e80;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_d0,0,(char *)0x0,local_208._M_unused._M_member_pointer);
  }
  else {
LAB_00151e80:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_208._M_pod_data,(ulong)local_d0);
  }
  local_1e8._0_8_ = &local_1d8;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar17) {
    local_1d8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1d8._8_8_ = puVar10[3];
  }
  else {
    local_1d8._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_1e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_1e8._8_8_ = puVar10[1];
  *puVar10 = paVar17;
  puVar10[1] = 0;
  paVar17->_M_local_buf[0] = '\0';
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((_Head_base<0UL,_httplib::Response_*,_false>)
             uVar6._M_t.
             super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
             super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
             super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
             (_Head_base<0UL,_httplib::Response_*,_false>)0x0,(char (*) [14])"Error state: ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [2])0x173c61,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
  }
  if (local_d0 != pcVar18) {
    operator_delete(local_d0,local_c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != &local_1f8) {
    operator_delete(local_208._M_unused._M_object,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,(ulong)((long)&local_128->_M_color + 1));
  }
  if ((size_type *)auStack_100._8_8_ != &local_e8) {
    operator_delete((void *)auStack_100._8_8_,local_e8 + 1);
  }
  if (local_158 != local_150._M_local_buf + 8) {
    operator_delete(local_158,local_150._8_8_ + 1);
  }
  if ((Response *)local_198._0_8_ != (Response *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  check<std::__cxx11::string&>
            (*(int *)((long)local_90.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20)
             == 200,(string *)
                    ((long)local_90.res_._M_t.
                           super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                           .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x28));
  p_Var3 = (_Base_ptr)
           (((string *)
            ((long)local_90.res_._M_t.
                   super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                   .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78))->
           _M_dataplus)._M_p;
  paVar17 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)local_90.res_._M_t.
                        super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                        .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x80);
  local_198._0_8_ = (Response *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"<title>","");
  local_1e8._0_8_ = &local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"</title>","");
  uVar8 = 0;
  local_208._M_unused._M_object = paVar17;
  local_208._8_8_ = p_Var3;
  sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,
                      (char *)local_198._0_8_,0,local_198._8_8_);
  pcVar18 = "";
  if (sVar11 != 0xffffffffffffffff) {
    sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,
                        (char *)local_1e8._0_8_,local_198._8_8_ + sVar11,local_1e8._8_8_);
    if (sVar12 == 0xffffffffffffffff) {
      uVar8 = 0;
    }
    else {
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(sVar11 + local_198._8_8_);
      if (local_208._M_unused._M_object < paVar17) {
        uVar13 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > __size (which is %zu)",
                            "basic_string_view::substr",paVar17);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._0_8_ != &local_1d8) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
        }
        if ((Response *)local_198._0_8_ != (Response *)local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_90.request_headers_._M_t);
        std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
                  (&local_90.res_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar13);
      }
      uVar8 = sVar12 - (long)paVar17;
      if ((ulong)((long)local_208._M_unused._0_8_ - (long)paVar17) < sVar12 - (long)paVar17) {
        uVar8 = (long)local_208._M_unused._0_8_ - (long)paVar17;
      }
      pcVar18 = (char *)((long)paVar17 + local_208._8_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
  }
  if ((Response *)local_198._0_8_ != (Response *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  pcVar1 = (token->content)._M_dataplus._M_p;
  local_198._0_8_ = (Response *)local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar1,pcVar1 + (token->content)._M_string_length);
  std::__cxx11::string::append(local_198);
  uVar13 = local_198._0_8_;
  bVar4 = true;
  if ((uVar8 == local_198._8_8_) &&
     ((uVar8 == 0 || (iVar7 = bcmp(pcVar18,(void *)local_198._0_8_,uVar8), iVar7 == 0)))) {
    bVar4 = false;
  }
  if ((Response *)uVar13 != (Response *)local_188) {
    operator_delete((void *)uVar13,(ulong)(local_188._0_8_ + 1));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
LAB_00152218:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90.request_headers_._M_t);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            (&local_90.res_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::std) {
				return "";
			}

			std::string tokenName = token.content;
			str::replace_all(tokenName, "::", "%3A%3A");

			const std::string url = "/mwiki/index.php?title=Special%3ASearch&search=" + tokenName;
			httplib::Result result = tokenClient.Get(url.c_str());
			check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
			check((result->status == 200) or (result->status == 302), result->reason);

			if (result->status == 302) { // direct hit!
				std::string redirectUrl = result->get_header_value("Location");
				redirectUrl = redirectUrl.substr(redirectUrl.find("/w"));

				result = tokenClient.Get(redirectUrl.c_str());
				check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
				check(result->status == 200, result->reason);

				const std::string_view title = snip_between(result->body, "<title>", "</title>").first;
				if (title != (token.content + " - cppreference.com")) {
					return "";
				}

				return url;
			}

			const std::optional<std::string_view> link = findLinkToSubtoken(result->body, token.content, ">", "<");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}